

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_parse_ini_string(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int bProcessSection;
  char *zIn;
  int nByte;
  sxu32 local_2c;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zIn = jx9_value_to_string(*apArg,(int *)&local_2c);
    bProcessSection = 0;
    if (nArg != 1) {
      bProcessSection = jx9_value_to_bool(apArg[1]);
    }
    jx9ParseIniString(pCtx,zIn,local_2c,bProcessSection);
  }
  return 0;
}

Assistant:

static int jx9Builtin_parse_ini_string(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIni;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE*/
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the raw INI buffer */
	zIni = jx9_value_to_string(apArg[0], &nByte);
	/* Process the INI buffer*/
	jx9ParseIniString(pCtx, zIni, (sxu32)nByte, (nArg > 1) ? jx9_value_to_bool(apArg[1]) : 0);
	return JX9_OK;
}